

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageOptions_SingleOptionSerializationAndDeserialization_Test
::CoapTest_CoapMessageOptions_SingleOptionSerializationAndDeserialization_Test
          (CoapTest_CoapMessageOptions_SingleOptionSerializationAndDeserialization_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00254ce0;
  return;
}

Assistant:

TEST(CoapTest, CoapMessageOptions_SingleOptionSerializationAndDeserialization)
{
    auto      message = std::make_shared<Message>(Type::kConfirmable, Code::kGet);
    ByteArray buffer;
    Error     error;

    EXPECT_EQ(message->SetContentFormat(ContentFormat::kCBOR), ErrorCode::kNone);
    EXPECT_EQ(message->Serialize(buffer), ErrorCode::kNone);

    EXPECT_EQ(buffer.size(), 4 + 2);
    EXPECT_EQ(buffer[4], 0xc1);
    EXPECT_EQ(buffer[5], utils::to_underlying(ContentFormat::kCBOR));

    message = Message::Deserialize(error, buffer);
    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetOptionNum(), 1);

    ContentFormat contentFormat;
    EXPECT_EQ(message->GetContentFormat(contentFormat), ErrorCode::kNone);
    EXPECT_EQ(contentFormat, ContentFormat::kCBOR);
}